

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-multi.cpp
# Opt level: O0

void __thiscall
WeightedIsomapAveraging::WeightedIsomapAveraging
          (WeightedIsomapAveraging *this,float merge_threshold)

{
  float local_2ec;
  MatExpr local_2e8 [4];
  float alpha_thresh;
  MatExpr local_178 [356];
  float local_14;
  WeightedIsomapAveraging *pWStack_10;
  float merge_threshold_local;
  WeightedIsomapAveraging *this_local;
  
  local_14 = merge_threshold;
  pWStack_10 = this;
  cv::Mat::Mat(&this->visibility_counter);
  cv::Mat::Mat(&this->merged_isomap);
  if (local_14 < 0.0 || 90.0 < local_14) {
    __assert_fail("merge_threshold >= 0.f && merge_threshold <= 90.f",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/examples/fit-model-multi.cpp"
                  ,0x51,"WeightedIsomapAveraging::WeightedIsomapAveraging(float)");
  }
  cv::Mat::zeros((int)local_178,0x200,0x200);
  cv::Mat::operator=(&this->visibility_counter,local_178);
  cv::MatExpr::~MatExpr(local_178);
  cv::Mat::zeros((int)local_2e8,0x200,0x200);
  cv::Mat::operator=(&this->merged_isomap,local_2e8);
  cv::MatExpr::~MatExpr(local_2e8);
  local_2ec = local_14 * -2.8333333 + 255.0;
  if (local_2ec < 0.0) {
    local_2ec = 0.0;
  }
  this->threshold = (uchar)(int)local_2ec;
  return;
}

Assistant:

WeightedIsomapAveraging(float merge_threshold = 90.0f)
    {
        assert(merge_threshold >= 0.f && merge_threshold <= 90.f);

        visibility_counter = cv::Mat::zeros(512, 512, CV_32SC1);
        merged_isomap = cv::Mat::zeros(512, 512, CV_32FC4);

        // map 0° to 255, 90° to 0:
        float alpha_thresh = (-255.f / 90.f) * merge_threshold + 255.f;
        if (alpha_thresh < 0.f) // could maybe happen due to float inaccuracies / rounding?
            alpha_thresh = 0.0f;
        threshold = static_cast<unsigned char>(alpha_thresh);
    }